

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O3

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  byte *pbVar1;
  SnapShot *pSVar2;
  IRIns *pIVar3;
  ushort uVar4;
  uint uVar5;
  CTypeID id;
  jit_State *J_00;
  SnapEntry *pSVar6;
  lua_State *L;
  IRIns *pIVar7;
  CTState *cts;
  IRIns *pIVar8;
  CTInfo info;
  IRIns *pIVar9;
  GCcdata *pGVar10;
  IRIns *pIVar11;
  TValue *pTVar12;
  uint uVar13;
  ulong uVar14;
  undefined4 uVar15;
  uint uVar16;
  uint8_t *puVar17;
  BloomFilter rfilt;
  IRIns *pIVar18;
  byte bVar19;
  IRIns *pIVar20;
  uint ref;
  IRRef2 IVar21;
  BCIns *pBVar22;
  ExitState *ex;
  ulong uVar23;
  CTSize sz;
  TValue *in_stack_ffffffffffffff48;
  CTSize in_stack_ffffffffffffff50;
  CTSize local_7c;
  TValue *local_78;
  ulong local_70;
  long local_68;
  GCtab *local_60;
  TValue local_58;
  lua_State *local_50;
  BCIns *local_48;
  SnapShot *local_40;
  IRIns *local_38;
  
  uVar5 = J->exitno;
  ex = (ExitState *)(ulong)uVar5;
  J_00 = (jit_State *)J->trace[J->parent].gcptr64;
  local_68 = (long)ex * 3;
  pSVar2 = (J_00->cur).snap + (long)ex;
  local_70 = (ulong)pSVar2->nent;
  uVar16 = pSVar2->mapofs;
  pIVar9 = (J_00->cur).ir;
  uVar23 = (ulong)((J_00->cur).nins - 1);
  pSVar6 = (J_00->cur).snapmap;
  if (*(char *)((long)pIVar9 + uVar23 * 8 + 5) == '\x14') {
    pIVar9 = pIVar9 + uVar23;
    rfilt = 0;
    do {
      if ((pIVar9->field_0).op2 <= uVar5) {
        rfilt = rfilt | 1L << ((ulong)*(byte *)pIVar9 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar9 + -3);
      pIVar9 = pIVar9 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    rfilt = 0;
  }
  pBVar22 = (BCIns *)(*(ulong *)(pSVar6 + uVar16 + local_70) >> 8);
  L = J->L;
  *(BCIns **)(((ulong)L->cframe & 0xfffffffffffffffc) + 0x18) = pBVar22 + 1;
  pTVar12 = L->base;
  bVar19 = pSVar2->topslot;
  if ((TValue *)(L->maxstack).ptr64 <= pTVar12 + bVar19) {
    L->top = pTVar12 + *(byte *)(*(long *)((pTVar12[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
    lj_state_growstack(L,(uint)bVar19 -
                         (uint)*(byte *)(*(long *)((pTVar12[-2].u64 & 0x7fffffffffff) + 0x20) +
                                        -0x5d));
    pTVar12 = L->base;
  }
  local_78 = pTVar12 + -2;
  local_40 = pSVar2;
  local_48 = pBVar22;
  local_50 = L;
  if (local_70 != 0) {
    uVar23 = 0;
    do {
      uVar13 = pSVar6[uVar16 + uVar23];
      pIVar9 = local_38;
      if ((uVar13 >> 0x12 & 1) == 0) {
        pTVar12 = local_78 + (uVar13 >> 0x18);
        ref = uVar13 & 0xffff;
        pIVar7 = (J_00->cur).ir;
        if (*(char *)((long)pIVar7 + (ulong)ref * 8 + 6) == -3) {
          if (uVar23 != 0) {
            uVar14 = 0;
            do {
              if ((pSVar6[uVar16 + uVar14] & 0xffff) == ref) {
                *pTVar12 = local_78[pSVar6[uVar16 + uVar14] >> 0x18];
                goto LAB_0012fadd;
              }
              uVar14 = uVar14 + 1;
            } while (uVar23 != uVar14);
          }
          pIVar3 = pIVar7 + ref;
          if ((pIVar3->field_1).o - 0x53 < 2) {
            cts = *(CTState **)((J->L->glref).ptr64 + 0x180);
            cts->L = J->L;
            id = pIVar7[(pIVar3->field_0).op1].field_1.op12;
            info = lj_ctype_info(cts,id,&local_7c);
            pGVar10 = lj_cdata_newx(cts,id,local_7c,info);
            pTVar12->u64 = (ulong)pGVar10 | 0xfffa800000000000;
            if ((pIVar3->field_1).o == 'T') {
              in_stack_ffffffffffffff48 =
                   (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),local_7c);
              snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,(ulong)(pIVar3->field_0).op2,
                               (int)pGVar10 + 0x10,in_stack_ffffffffffffff48,
                               in_stack_ffffffffffffff50);
              pIVar9 = local_38;
            }
            else {
              uVar4 = (&((J_00->cur).snap)->ref)[local_68 * 2];
              pIVar7 = (J_00->cur).ir;
              pIVar18 = pIVar3;
LAB_0012f824:
              pIVar8 = pIVar18;
              pIVar18 = pIVar8 + 1;
              pIVar9 = local_38;
              if (pIVar18 < pIVar7 + uVar4) {
                if (*(char *)((long)pIVar8 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar8 + 0xf) == 0xff) {
                    uVar13 = *(byte *)((long)pIVar8 + 0xd) - 0x4a;
                    if ((4 < uVar13) || (uVar13 == 2)) goto LAB_0012f824;
                    pIVar20 = (J_00->cur).ir;
                    uVar14 = (ulong)(pIVar18->field_0).op1;
                    pIVar9 = pIVar20 + uVar14;
                    if (((pIVar9->field_1).o & 0xfe) == 0x38) {
                      pIVar9 = pIVar20 + (pIVar9->field_0).op1;
                    }
                    if (pIVar20 + (pIVar9->field_0).op1 != pIVar3) goto LAB_0012f824;
                  }
                  else {
                    if (pIVar18 != pIVar3 + *(byte *)((long)pIVar8 + 0xf)) goto LAB_0012f824;
                    pIVar20 = (J_00->cur).ir;
                    uVar14 = (ulong)(pIVar18->field_0).op1;
                  }
                  uVar15 = 8;
                  if ((0x605fd9U >> (*(uint *)((long)pIVar8 + 0xc) & 0x1f) & 1) == 0) {
                    bVar19 = ((byte)*(uint *)((long)pIVar8 + 0xc) & 0x1f) - 0xf;
                    uVar15 = 4;
                    if (bVar19 < 4) {
                      uVar15 = *(undefined4 *)(&DAT_00163ac4 + (ulong)bVar19 * 4);
                    }
                  }
                  uVar14 = (ulong)*(ushort *)((long)pIVar20 + uVar14 * 8 + 2);
                  if (*(char *)((long)pIVar20 + uVar14 * 8 + 5) == '\x1d') {
                    IVar21 = pIVar20[uVar14 + 1].i;
                  }
                  else {
                    IVar21 = pIVar20[uVar14].field_1.op12;
                  }
                  in_stack_ffffffffffffff48 =
                       (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),uVar15);
                  snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                   (ulong)*(ushort *)((long)pIVar8 + 10),IVar21 + (int)pGVar10,
                                   in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
                }
                goto LAB_0012f824;
              }
            }
          }
          else {
            if ((pIVar3->field_1).o == 0x51) {
              local_60 = lj_tab_new(J->L,(uint)(pIVar3->field_0).op1,(uint)(pIVar3->field_0).op2);
            }
            else {
              local_60 = lj_tab_dup(J->L,(GCtab *)pIVar7[(ulong)(pIVar3->field_0).op1 + 1]);
            }
            pTVar12->u64 = (ulong)local_60 | 0xfffa000000000000;
            uVar4 = (&((J_00->cur).snap)->ref)[local_68 * 2];
            pIVar7 = (J_00->cur).ir;
            pIVar18 = pIVar3;
            pIVar8 = pIVar3;
            pIVar9 = local_38;
joined_r0x0012f97c:
            local_38 = pIVar8;
            pIVar3 = pIVar3 + 1;
            if (pIVar3 < pIVar7 + uVar4) {
              pIVar8 = local_38;
              pIVar9 = local_38;
              if ((pIVar3->field_1).r == 0xfe) {
                if ((ulong)(pIVar3->field_1).s == 0xff) {
                  uVar13 = (pIVar3->field_1).o - 0x4a;
                  if ((4 < uVar13) || (uVar13 == 2)) goto joined_r0x0012f97c;
                  pIVar11 = (J_00->cur).ir;
                  uVar14 = (ulong)(pIVar3->field_0).op1;
                  pIVar20 = pIVar11 + uVar14;
                  bVar19 = (pIVar20->field_1).o;
                  if ((bVar19 & 0xfe) == 0x38) {
                    pIVar20 = pIVar11 + (pIVar20->field_0).op1;
                  }
                  if (pIVar11 + (pIVar20->field_0).op1 != pIVar18) goto joined_r0x0012f97c;
                }
                else {
                  if (pIVar3 != pIVar18 + (pIVar3->field_1).s) goto joined_r0x0012f97c;
                  pIVar11 = (J_00->cur).ir;
                  uVar14 = (ulong)(pIVar3->field_0).op1;
                  bVar19 = *(byte *)((long)pIVar11 + uVar14 * 8 + 5);
                }
                if (bVar19 == 0x3e) {
                  in_stack_ffffffffffffff48 = &local_58;
                  snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,
                                  (uint)(pIVar3->field_0).op2,in_stack_ffffffffffffff48);
                  (local_60->metatable).gcptr64 = local_58.u64 & 0x7fffffffffff;
                  pIVar8 = local_38;
                  pIVar9 = local_38;
                }
                else {
                  pIVar9 = pIVar11 + *(ushort *)((long)pIVar11 + uVar14 * 8 + 2);
                  if ((pIVar9->field_1).o == '\x1e') {
                    pIVar9 = pIVar11 + (pIVar9->field_0).op1;
                  }
                  lj_ir_kvalue(J->L,&local_58,pIVar9);
                  in_stack_ffffffffffffff48 = lj_tab_set(J->L,local_60,&local_58);
                  snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,
                                  (uint)(pIVar3->field_0).op2,in_stack_ffffffffffffff48);
                  pIVar18 = local_38;
                  pIVar8 = local_38;
                  pIVar9 = local_38;
                }
              }
              goto joined_r0x0012f97c;
            }
          }
        }
        else {
          in_stack_ffffffffffffff48 = pTVar12;
          snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,ref,pTVar12);
          pIVar9 = local_38;
          if ((uVar13 >> 0x14 & 1) != 0) {
            (pTVar12->field_4).i = (int)pTVar12->n;
            (pTVar12->field_4).it = 0xfffe7fff;
          }
        }
      }
LAB_0012fadd:
      local_38 = pIVar9;
      uVar23 = uVar23 + 1;
    } while (uVar23 != local_70);
    pTVar12 = local_50->base;
  }
  pTVar12 = pTVar12 + (byte)pSVar6[uVar16 + local_70];
  local_50->base = pTVar12;
  uVar16 = (byte)*local_48 - 0x3f;
  uVar5 = uVar16 >> 1;
  if ((((uVar5 | (uint)((uVar16 & 1) != 0) << 0x1f) < 6) && ((0x27U >> (uVar5 & 0x1f) & 1) != 0)) ||
     (0x58 < (byte)*local_48)) {
    puVar17 = &local_40->nslots;
  }
  else {
    puVar17 = (uint8_t *)(*(long *)((pTVar12[-2].u64 & 0x7fffffffffff) + 0x20) + -0x5d);
    local_78 = pTVar12;
  }
  local_50->top = local_78 + *puVar17;
  return local_48;
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      } else if ((sn & SNAP_KEYINDEX)) {
	/* A IRT_INT key index slot is restored as a number. Undo this. */
	o->u32.lo = (uint32_t)(LJ_DUALNUM ? intV(o) : lj_num2int(numV(o)));
	o->u32.hi = LJ_KEYINDEX;
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  return pc;
}